

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>::write
          (arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
           *this,char_type *value)

{
  char_type cVar1;
  format_specs *spec;
  char *pcVar2;
  _Distance __n;
  size_t sVar3;
  ssize_t extraout_RAX;
  ssize_t sVar4;
  format_error *this_00;
  ulong uVar5;
  size_t sVar6;
  counting_iterator<char> *it;
  char *data;
  str_writer<char> local_20;
  
  if (value != (char_type *)0x0) {
    sVar3 = strlen(value);
    spec = this->specs_;
    if (spec == (format_specs *)0x0) {
      pcVar2 = &(this->writer_).out_.blackhole_;
      sVar6 = 0;
      if (0 < (long)sVar3) {
        sVar6 = sVar3;
        pcVar2 = value + (sVar3 - 1);
      }
      cVar1 = *pcVar2;
      sVar4 = CONCAT71((int7)(sVar3 >> 8),cVar1);
      (this->writer_).out_.count_ = (this->writer_).out_.count_ + sVar6;
      (this->writer_).out_.blackhole_ = cVar1;
    }
    else {
      uVar5 = (ulong)(spec->super_core_format_specs).precision;
      local_20.size_ = sVar3;
      if (uVar5 < sVar3) {
        local_20.size_ = uVar5;
      }
      if ((long)uVar5 < 0) {
        local_20.size_ = sVar3;
      }
      local_20.s = value;
      basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::
      write_padded<fmt::v5::basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>::str_writer<char>>
                ((basic_writer<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
                  *)this,&spec->super_align_spec,&local_20);
      sVar4 = extraout_RAX;
    }
    return sVar4;
  }
  this_00 = (format_error *)__cxa_allocate_exception(0x10);
  format_error::format_error(this_00,"string pointer is null");
  __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }